

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O0

void loadNodeBuffer(void)

{
  PFNGLBUFFERDATAPROC p_Var1;
  GLboolean GVar2;
  size_type sVar3;
  const_reference pvVar4;
  undefined1 local_20 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> nodeIDs;
  
  bintree::precomputeNodes
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_20,&g_bintree);
  GVar2 = (*glad_glIsBuffer)(g_gl.nodeBuffer);
  if (GVar2 != '\0') {
    (*glad_glDeleteBuffers)(1,(GLuint *)0x24694c);
  }
  (*glad_glGenBuffers)(1,(GLuint *)0x24694c);
  (*glad_glBindBuffer)(0x90d2,g_gl.nodeBuffer);
  p_Var1 = glad_glBufferData;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_20);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_20,0);
  (*p_Var1)(0x90d2,sVar3 << 2,pvVar4,0x88e4);
  (*glad_glBindBuffer)(0x90d2,0);
  (*glad_glBindBufferBase)(0x90d2,0,g_gl.nodeBuffer);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_20);
  return;
}

Assistant:

void loadNodeBuffer()
{
    const std::vector<uint32_t> nodeIDs = g_bintree.precomputeNodes();

    if (glIsBuffer(g_gl.nodeBuffer))
        glDeleteBuffers(1, &g_gl.nodeBuffer);
    glGenBuffers(1, &g_gl.nodeBuffer);
    glBindBuffer(GL_SHADER_STORAGE_BUFFER, g_gl.nodeBuffer);
    glBufferData(GL_SHADER_STORAGE_BUFFER,
                 sizeof(nodeIDs[0]) * nodeIDs.size(),
                 &nodeIDs[0],
                 GL_STATIC_DRAW);
    glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
    glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, g_gl.nodeBuffer);
}